

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_copy.cpp
# Opt level: O3

unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true> __thiscall
duckdb::Transformer::TransformCopy(Transformer *this,PGCopyStmt *stmt)

{
  QueryNode *pQVar1;
  string *table_name;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  Transformer *pTVar5;
  pointer pCVar6;
  type info;
  pointer this_00;
  long in_RDX;
  char *pcVar7;
  long lVar8;
  undefined8 *puVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  optional_ptr<duckdb_libpgquery::PGResTarget,_true> target;
  allocator_type local_b9;
  __uniq_ptr_impl<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>_> local_b8;
  Transformer *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  undefined1 local_90 [32];
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> *local_70;
  unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> local_60 [2]
  ;
  pointer local_50 [2];
  undefined1 local_40 [16];
  
  local_b0 = (Transformer *)stmt;
  pTVar5 = (Transformer *)operator_new(0x80);
  CopyStatement::CopyStatement((CopyStatement *)pTVar5);
  (this->parent).ptr = pTVar5;
  local_b8._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>.
  super__Head_base<0UL,_duckdb::CopyStatement_*,_false>._M_head_impl =
       (tuple<duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)
       (tuple<duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)this;
  pCVar6 = unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true>::
           operator->((unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>,_true>
                       *)this);
  info = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                   (&pCVar6->info);
  bVar4 = *(bool *)(in_RDX + 0x20);
  info->is_from = bVar4;
  pcVar7 = *(char **)(in_RDX + 0x28);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "/dev/stdout";
    if (bVar4 != false) {
      pcVar7 = "/dev/stdin";
    }
  }
  else {
    strlen(pcVar7);
  }
  table_name = &info->file_path;
  ::std::__cxx11::string::_M_replace
            ((ulong)table_name,0,(char *)(info->file_path)._M_string_length,(ulong)pcVar7);
  pQVar1 = (QueryNode *)(local_90 + 0x10);
  pcVar7 = "parquet";
  local_90._0_8_ = pQVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"parquet","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_90;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_a8,__l,&local_b9);
  bVar4 = ReplacementScan::CanReplace(table_name,&local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  if ((QueryNode *)local_90._0_8_ != pQVar1) {
    operator_delete((void *)local_90._0_8_);
  }
  if (!bVar4) {
    local_90._0_8_ = pQVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"json","");
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"jsonl","");
    local_50[0] = (pointer)local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ndjson","");
    __l_00._M_len = 3;
    __l_00._M_array = (iterator)local_90;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8,__l_00,&local_b9);
    bVar4 = ReplacementScan::CanReplace(table_name,&local_a8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    lVar8 = 0;
    do {
      if (local_40 + lVar8 != *(undefined1 **)((long)local_50 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_50 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x60);
    pcVar7 = "csv";
    if (bVar4) {
      pcVar7 = "json";
    }
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)&info->format,0,(char *)(info->format)._M_string_length,(ulong)pcVar7);
  if ((*(long *)(in_RDX + 0x18) != 0) &&
     (puVar9 = *(undefined8 **)(*(long *)(in_RDX + 0x18) + 8), puVar9 != (undefined8 *)0x0)) {
    do {
      local_90._0_8_ = *puVar9;
      optional_ptr<duckdb_libpgquery::PGResTarget,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)local_90);
      if (*(long *)(local_90._0_8_ + 8) != 0) {
        optional_ptr<duckdb_libpgquery::PGResTarget,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGResTarget,_true> *)local_90);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &info->select_list,(char **)(local_90._0_8_ + 8));
      }
      puVar9 = (undefined8 *)puVar9[1];
    } while (puVar9 != (undefined8 *)0x0);
  }
  pTVar5 = local_b0;
  if (*(long *)(in_RDX + 8) == 0) {
    TransformSelectNode((Transformer *)local_90,(PGNode *)local_b0,
                        SUB81(*(undefined8 *)(in_RDX + 0x10),0));
    uVar3 = local_90._0_8_;
    local_90._0_8_ = (QueryNode *)0x0;
    _Var2._M_head_impl =
         (info->select_statement).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (info->select_statement).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar3;
    if (_Var2._M_head_impl == (QueryNode *)0x0) goto LAB_0126a8ea;
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  else {
    TransformRangeVar((Transformer *)local_90,(PGRangeVar *)local_b0);
    this_00 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                        ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                          *)local_90);
    TableRef::Cast<duckdb::BaseTableRef>(this_00);
    ::std::__cxx11::string::_M_assign((string *)&info->table);
    ::std::__cxx11::string::_M_assign((string *)&info->schema);
    ::std::__cxx11::string::_M_assign((string *)&info->catalog);
  }
  if ((QueryNode *)local_90._0_8_ != (QueryNode *)0x0) {
    (**(code **)(*(long *)local_90._0_8_ + 8))();
  }
LAB_0126a8ea:
  TransformCopyOptions(pTVar5,info,*(PGList **)(in_RDX + 0x30));
  return (unique_ptr<duckdb::CopyStatement,_std::default_delete<duckdb::CopyStatement>_>)
         (_Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>)
         local_b8._M_t.
         super__Tuple_impl<0UL,_duckdb::CopyStatement_*,_std::default_delete<duckdb::CopyStatement>_>
         .super__Head_base<0UL,_duckdb::CopyStatement_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CopyStatement> Transformer::TransformCopy(duckdb_libpgquery::PGCopyStmt &stmt) {
	auto result = make_uniq<CopyStatement>();
	auto &info = *result->info;

	// get file_path and is_from
	info.is_from = stmt.is_from;
	if (!stmt.filename) {
		// stdin/stdout
		info.file_path = info.is_from ? "/dev/stdin" : "/dev/stdout";
	} else {
		// copy to a file
		info.file_path = stmt.filename;
	}

	if (ReplacementScan::CanReplace(info.file_path, {"parquet"})) {
		info.format = "parquet";
	} else if (ReplacementScan::CanReplace(info.file_path, {"json", "jsonl", "ndjson"})) {
		info.format = "json";
	} else {
		info.format = "csv";
	}

	// get select_list
	if (stmt.attlist) {
		for (auto n = stmt.attlist->head; n != nullptr; n = n->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGResTarget>(n->data.ptr_value);
			if (target->name) {
				info.select_list.emplace_back(target->name);
			}
		}
	}

	if (stmt.relation) {
		auto ref = TransformRangeVar(*stmt.relation);
		auto &table = ref->Cast<BaseTableRef>();
		info.table = table.table_name;
		info.schema = table.schema_name;
		info.catalog = table.catalog_name;
	} else {
		info.select_statement = TransformSelectNode(*stmt.query);
	}

	// handle the different options of the COPY statement
	TransformCopyOptions(info, stmt.options);

	return result;
}